

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

void __thiscall
soul::Value::PackedData::ArrayIterator::ArrayIterator(ArrayIterator *this,PackedData *p)

{
  uint64_t uVar1;
  
  Type::getElementType(&this->elementType,p->type);
  this->element = p->data;
  this->index = 0;
  if ((p->type->category & ~primitive) == vector) {
    this->numElements = (long)p->type->boundingSize;
    uVar1 = Type::getPackedSizeInBytes(&this->elementType);
    this->elementSize = uVar1;
    return;
  }
  throwInternalCompilerError("isArrayOrVector()","getArrayOrVectorSize",0x137);
}

Assistant:

ArrayIterator (const PackedData& p)
            : elementType (p.type.getElementType()), element (p.data),
              numElements (p.type.getArrayOrVectorSize()), elementSize ((size_t) elementType.getPackedSizeInBytes())
        {}